

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O0

void dlib::cpu::prelu_gradient
               (tensor *grad,tensor *src,tensor *gradient_input,tensor *param,tensor *params_grad)

{
  uint uVar1;
  undefined1 auVar2 [16];
  enable_if_t<std::is_convertible<tensor_*,_tensor_*>::value____std::is_convertible<tensor_*,_tensor_*>::value,_bool>
  eVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  ostream *poVar7;
  string *a;
  uint *puVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_t sVar11;
  long *in_RCX;
  tensor *in_RDX;
  tensor *in_RSI;
  tensor *in_RDI;
  long *in_R8;
  size_t i;
  float pgrad;
  float *out;
  float *s;
  float *gi;
  float p;
  ostringstream dlib_o_out;
  error_type t;
  ulong local_200;
  uint local_1f4;
  ostringstream local_1a0 [376];
  long *local_28;
  long *local_20;
  tensor *local_18;
  tensor *local_10;
  tensor *local_8;
  long lVar9;
  long lVar10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  eVar3 = is_same_object<dlib::tensor,dlib::tensor>(in_RDI,in_RDX);
  if (eVar3) {
    dlib_assert_breakpoint();
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar6 = std::operator<<((ostream *)local_1a0,"\n\nError detected at line ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x7b1);
    std::operator<<(poVar6,".\n");
    poVar6 = std::operator<<((ostream *)local_1a0,"Error detected in file ");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                            );
    std::operator<<(poVar6,".\n");
    poVar6 = std::operator<<((ostream *)local_1a0,"Error detected in function ");
    poVar6 = std::operator<<(poVar6,
                             "void dlib::cpu::prelu_gradient(tensor &, const tensor &, const tensor &, const tensor &, tensor &)"
                            );
    std::operator<<(poVar6,".\n\n");
    poVar6 = std::operator<<((ostream *)local_1a0,"Failing expression was ");
    poVar6 = std::operator<<(poVar6,"is_same_object(grad, gradient_input) == false");
    std::operator<<(poVar6,".\n");
    poVar6 = (ostream *)std::ostream::operator<<(local_1a0,std::boolalpha);
    poVar7 = std::operator<<(poVar6,"");
    std::operator<<(poVar7,"\n");
    t = (error_type)((ulong)poVar7 >> 0x20);
    a = (string *)__cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error((fatal_error *)poVar6,t,a);
    __cxa_throw(a,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  puVar8 = (uint *)(**(code **)(*local_20 + 0x10))();
  uVar1 = *puVar8;
  iVar4 = (*local_18->_vptr_tensor[2])();
  lVar9 = CONCAT44(extraout_var,iVar4);
  iVar4 = (*local_10->_vptr_tensor[2])();
  iVar5 = (*local_8->_vptr_tensor[3])();
  lVar10 = CONCAT44(extraout_var_01,iVar5);
  local_1f4 = 0;
  local_200 = 0;
  while( true ) {
    sVar11 = tensor::size(local_10);
    if (sVar11 <= local_200) break;
    if (*(float *)(CONCAT44(extraout_var_00,iVar4) + local_200 * 4) <= 0.0) {
      auVar2 = vfmadd213ss_fma(ZEXT416(*(uint *)(lVar9 + local_200 * 4)),ZEXT416(uVar1),
                               ZEXT416(*(uint *)(lVar10 + local_200 * 4)));
      *(int *)(lVar10 + local_200 * 4) = auVar2._0_4_;
      auVar2 = vfmadd213ss_fma(ZEXT416(*(uint *)(CONCAT44(extraout_var_00,iVar4) + local_200 * 4)),
                               ZEXT416(*(uint *)(lVar9 + local_200 * 4)),ZEXT416(local_1f4));
      local_1f4 = auVar2._0_4_;
    }
    else {
      *(float *)(lVar10 + local_200 * 4) =
           *(float *)(lVar9 + local_200 * 4) + *(float *)(lVar10 + local_200 * 4);
    }
    local_200 = local_200 + 1;
  }
  puVar8 = (uint *)(**(code **)(*local_28 + 0x18))();
  *puVar8 = local_1f4;
  return;
}

Assistant:

void prelu_gradient (
            tensor& grad,
            const tensor& src,
            const tensor& gradient_input,
            const tensor& param,
            tensor& params_grad 
        )
        {
            DLIB_CASSERT(is_same_object(grad, gradient_input) == false);
            const float p = param.host()[0];
            const float* gi = gradient_input.host();
            const float* s = src.host();
            float* out = grad.host();
            float pgrad = 0;
            for (size_t i = 0; i < src.size(); ++i)
            {
                if (s[i] > 0)
                {
                    out[i] += gi[i];
                }
                else
                {
                    out[i] += p*gi[i];
                    pgrad += gi[i]*s[i];
                }
            }
            params_grad.host()[0] = pgrad;
        }